

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

vector<short,_std::allocator<short>_> *
multiplicative_inverse_vector
          (vector<short,_std::allocator<short>_> *__return_storage_ptr__,coefficient_t m)

{
  pointer psVar1;
  int iVar2;
  undefined6 in_register_00000032;
  long lVar3;
  allocator_type local_19;
  
  iVar2 = (int)CONCAT62(in_register_00000032,m);
  std::vector<short,_std::allocator<short>_>::vector(__return_storage_ptr__,(long)iVar2,&local_19);
  psVar1 = (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1[1] = 1;
  for (lVar3 = 2; lVar3 < iVar2; lVar3 = lVar3 + 1) {
    psVar1[lVar3] =
         m - (short)(((int)(short)(m / (short)lVar3) * (int)psVar1[(short)(m % (short)lVar3)]) %
                    iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<coefficient_t> multiplicative_inverse_vector(const coefficient_t m) {
	std::vector<coefficient_t> inverse(m);
	inverse[1] = 1;
	// m = a * (m / a) + m % a
	// Multipying with inverse(a) * inverse(m % a):
	// 0 = inverse(m % a) * (m / a)  + inverse(a)  (mod m)
	for (coefficient_t a = 2; a < m; ++a) inverse[a] = m - (inverse[m % a] * (m / a)) % m;
	return inverse;
}